

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O1

void gray_render_span(int count,QT_FT_Span *spans,PWorker worker)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  byte *__s;
  uchar *puVar5;
  
  if (0 < count) {
    iVar3 = count + 1;
    puVar5 = &spans->coverage;
    do {
      iVar2 = (worker->target).pitch;
      lVar4 = (long)(worker->target).buffer - (long)*(int *)(puVar5 + -4) * (long)iVar2;
      if (-1 < (long)iVar2) {
        lVar4 = lVar4 + (ulong)(uint)(((worker->target).rows + -1) * iVar2);
      }
      bVar1 = *puVar5;
      if (bVar1 != 0) {
        __s = (byte *)(lVar4 + ((QT_FT_Span *)(puVar5 + -0xc))->x);
        switch(*(int *)(puVar5 + -8)) {
        case 0:
          break;
        case 7:
          *__s = bVar1;
          __s = __s + 1;
        case 6:
          *__s = bVar1;
          __s = __s + 1;
        case 5:
          *__s = bVar1;
          __s = __s + 1;
        case 4:
          *__s = bVar1;
          __s = __s + 1;
        case 3:
          *__s = bVar1;
          __s = __s + 1;
        case 2:
          *__s = bVar1;
          __s = __s + 1;
        case 1:
          *__s = bVar1;
          break;
        default:
          memset(__s,(uint)bVar1,(long)*(int *)(puVar5 + -8));
        }
      }
      iVar3 = iVar3 + -1;
      puVar5 = puVar5 + 0x10;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

static void
  gray_render_span( int                count,
                    const QT_FT_Span*  spans,
                    PWorker            worker )
  {
    unsigned char*  p;
    QT_FT_Bitmap*      map = &worker->target;

    for ( ; count > 0; count--, spans++ )
    {
      unsigned char  coverage = spans->coverage;

      /* first of all, compute the scanline offset */
      p = (unsigned char*)map->buffer - spans->y * map->pitch;
      if ( map->pitch >= 0 )
        p += ( map->rows - 1 ) * (unsigned int)map->pitch;


      if ( coverage )
      {
        unsigned char*  q = p + spans->x;


        /* For small-spans it is faster to do it by ourselves than
         * calling `memset'.  This is mainly due to the cost of the
         * function call.
         */
        switch ( spans->len )
        {
        case 7: *q++ = coverage; Q_FALLTHROUGH();
        case 6: *q++ = coverage; Q_FALLTHROUGH();
        case 5: *q++ = coverage; Q_FALLTHROUGH();
        case 4: *q++ = coverage; Q_FALLTHROUGH();
        case 3: *q++ = coverage; Q_FALLTHROUGH();
        case 2: *q++ = coverage; Q_FALLTHROUGH();
        case 1: *q   = coverage; Q_FALLTHROUGH();
        case 0: break;
        default:
          QT_FT_MEM_SET( q, coverage, spans->len );
        }
      }
    }
  }